

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  secp256k1_scalar s;
  secp256k1_scalar local_48;
  
  if (0 < len) {
    memset(wnaf,0,(ulong)(uint)len << 2);
  }
  local_48.d[2] = a->d[2];
  local_48.d[3] = a->d[3];
  local_48.d[0] = a->d[0];
  local_48.d[1] = a->d[1];
  iVar1 = 1;
  if ((long)a->d[3] < 0) {
    secp256k1_scalar_negate(&local_48,&local_48);
    iVar1 = -1;
  }
  if (len < 1) {
    iVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar7 = 0xffffffff;
    uVar4 = 0;
    do {
      uVar8 = uVar4 >> 6;
      bVar2 = (byte)uVar4 & 0x3f;
      uVar6 = (uint)(local_48.d[uVar8] >> bVar2);
      if ((uVar6 & 1) == uVar3) {
        uVar6 = uVar4 + 1;
      }
      else {
        iVar5 = len - uVar4;
        if (w <= (int)(len - uVar4)) {
          iVar5 = w;
        }
        if ((uVar4 + iVar5) - 1 >> 6 != uVar8) {
          uVar6 = uVar6 | (uint)(local_48.d[(ulong)uVar8 + 1] << (-bVar2 & 0x3f));
        }
        uVar7 = ((uVar6 << (-(char)iVar5 & 0x1fU)) >> (-(char)iVar5 & 0x1fU)) + uVar3;
        bVar9 = (uVar7 >> (w - 1U & 0x1f) & 1) != 0;
        uVar3 = (uint)bVar9;
        wnaf[(int)uVar4] = (uVar7 - ((uint)bVar9 << ((byte)w & 0x1f))) * iVar1;
        uVar6 = iVar5 + uVar4;
        uVar7 = uVar4;
      }
      uVar4 = uVar6;
    } while ((int)uVar4 < len);
    iVar1 = uVar7 + 1;
  }
  return iVar1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    for (bit = 0; bit < len; bit++) {
        wnaf[bit] = 0;
    }

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    bit = 0;
    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}